

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool ssl_prefs_check(Curl_easy *data)

{
  ulong uVar1;
  ulong uVar2;
  char *fmt;
  
  uVar1 = (data->set).ssl.primary.version;
  if (uVar1 < 8) {
    uVar2 = (data->set).ssl.primary.version_max;
    if ((uVar2 & 0xfffffffffffeffff) == 0) {
      return true;
    }
    if ((long)uVar1 <= (long)uVar2 >> 0x10) {
      return true;
    }
    fmt = "CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION";
  }
  else {
    fmt = "Unrecognized parameter value passed via CURLOPT_SSLVERSION";
  }
  Curl_failf(data,fmt);
  return false;
}

Assistant:

static bool ssl_prefs_check(struct Curl_easy *data)
{
  /* check for CURLOPT_SSLVERSION invalid parameter value */
  const long sslver = data->set.ssl.primary.version;
  if((sslver < 0) || (sslver >= CURL_SSLVERSION_LAST)) {
    failf(data, "Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    return FALSE;
  }

  switch(data->set.ssl.primary.version_max) {
  case CURL_SSLVERSION_MAX_NONE:
  case CURL_SSLVERSION_MAX_DEFAULT:
    break;

  default:
    if((data->set.ssl.primary.version_max >> 16) < sslver) {
      failf(data, "CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION");
      return FALSE;
    }
  }

  return TRUE;
}